

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

ssize_t __thiscall
Imf_3_2::DwaCompressor::Classifier::write(Classifier *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  char **out;
  
  out = (char **)CONCAT44(in_register_00000034,__fd);
  Xdr::write<Imf_3_2::CharPtrIO,char*>(out,(this->_suffix)._M_dataplus._M_p);
  Xdr::write<Imf_3_2::CharPtrIO,char*>
            (out,((char)(this->_cscIdx << 4) + ((byte)this->_scheme & 3) * '\x04' |
                 this->_caseInsensitive) + 0x10);
  Xdr::write<Imf_3_2::CharPtrIO,char*>(out,(char)this->_type);
  return extraout_RAX;
}

Assistant:

void write (char*& ptr) const
    {
        Xdr::write<CharPtrIO> (ptr, _suffix.c_str ());

        // Encode _cscIdx (-1-3) in the upper 4 bits,
        //        _scheme (0-2)  in the next 2 bits
        //        _caseInsen     in the bottom bit
        unsigned char value = 0;
        value |= ((unsigned char) (_cscIdx + 1) & 15) << 4;
        value |= ((unsigned char) _scheme & 3) << 2;
        value |= (unsigned char) _caseInsensitive & 1;

        Xdr::write<CharPtrIO> (ptr, value);
        Xdr::write<CharPtrIO> (ptr, (unsigned char) _type);
    }